

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

void feat_copy(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = fcb->window_size;
  for (lVar5 = (long)-iVar1; lVar5 <= iVar1; lVar5 = lVar5 + 1) {
    uVar4 = 0;
    for (lVar6 = 0; lVar6 < fcb->n_stream; lVar6 = lVar6 + 1) {
      uVar2 = (ulong)fcb->stream_len[lVar6] / (ulong)(iVar1 * 2 + 1);
      iVar3 = (int)uVar2;
      memcpy(feat[lVar6] + (uint)(iVar3 * (iVar1 + (int)lVar5)),mfc[lVar5] + uVar4,uVar2 * 4);
      uVar4 = (ulong)(uint)(iVar3 + (int)uVar4);
    }
  }
  return;
}

Assistant:

static void
feat_copy(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    int32 win, i, j;

    win = feat_window_size(fcb);

    /* Concatenate input features */
    for (i = -win; i <= win; ++i) {
        uint32 spos = 0;

        for (j = 0; j < feat_n_stream(fcb); ++j) {
            uint32 stream_len;

            /* Unscale the stream length by the window. */
            stream_len = feat_stream_len(fcb, j) / (2 * win + 1);
            memcpy(feat[j] + ((i + win) * stream_len),
                   mfc[i] + spos,
                   stream_len * sizeof(mfcc_t));
            spos += stream_len;
        }
    }
}